

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Toplex_map.h
# Opt level: O3

set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> * __thiscall
Gudhi::Toplex_map::unitary_collapse
          (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
           *__return_storage_ptr__,Toplex_map *this,Vertex k,Vertex d)

{
  _Rb_tree_header *p_Var1;
  iterator iVar2;
  _Rb_tree_node_base *p_Var3;
  __node_base _Var4;
  pair<std::_Rb_tree_iterator<unsigned_long>,_std::_Rb_tree_iterator<unsigned_long>_> pVar5;
  Vertex v;
  __alloc_node_gen_t __alloc_node_gen;
  unsigned_long local_b0;
  Vertex local_a8;
  Vertex local_a0;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_true>_>_>
  local_98;
  _Rb_tree_node_base local_90;
  _Hashtable<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Identity,_Gudhi::Toplex_map::Sptr_equal,_Gudhi::Toplex_map::Sptr_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8 = d;
  local_a0 = k;
  iVar2 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_a8);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  local_98._M_h = (__hashtable_alloc *)&local_68;
  local_68._M_buckets = (__buckets_ptr)0x0;
  local_68._M_bucket_count =
       *(size_type *)
        ((long)iVar2.
               super__Node_iterator_base<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_false>
               ._M_cur + 0x18);
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count =
       *(size_type *)
        ((long)iVar2.
               super__Node_iterator_base<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_false>
               ._M_cur + 0x28);
  local_68._M_rehash_policy._0_8_ =
       *(undefined8 *)
        ((long)iVar2.
               super__Node_iterator_base<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_false>
               ._M_cur + 0x30);
  local_68._M_rehash_policy._M_next_resize =
       *(size_t *)
        ((long)iVar2.
               super__Node_iterator_base<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_false>
               ._M_cur + 0x38);
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>,std::__detail::_Identity,Gudhi::Toplex_map::Sptr_equal,Gudhi::Toplex_map::Sptr_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign<std::_Hashtable<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>,std::__detail::_Identity,Gudhi::Toplex_map::Sptr_equal,Gudhi::Toplex_map::Sptr_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,true>>>>
            ((_Hashtable<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>,std::__detail::_Identity,Gudhi::Toplex_map::Sptr_equal,Gudhi::Toplex_map::Sptr_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_98._M_h,
             (_Hashtable<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Identity,_Gudhi::Toplex_map::Sptr_equal,_Gudhi::Toplex_map::Sptr_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)((long)iVar2.
                       super__Node_iterator_base<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_false>
                       ._M_cur + 0x10),&local_98);
  if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var4._M_nxt = local_68._M_before_begin._M_nxt;
    do {
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                  *)&local_98,
                 (_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                  *)_Var4._M_nxt[1]._M_nxt);
      erase_maximal(this,(Simplex_ptr *)(_Var4._M_nxt + 1));
      pVar5 = std::
              _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
              ::equal_range((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                             *)&local_98,&local_a8);
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::_M_erase_aux((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)&local_98,(_Base_ptr)pVar5.first._M_node,(_Base_ptr)pVar5.second._M_node);
      for (p_Var3 = local_90._M_left; p_Var3 != &local_90;
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        local_b0 = *(unsigned_long *)(p_Var3 + 1);
        std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::_M_insert_unique<unsigned_long_const&>
                  ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                    *)__return_storage_ptr__,&local_b0);
      }
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)&local_98,&local_a0);
      insert_simplex<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
                (this,(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&local_98);
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&local_98);
      _Var4._M_nxt = (_Var4._M_nxt)->_M_nxt;
    } while (_Var4._M_nxt != (_Hash_node_base *)0x0);
  }
  std::
  _Hashtable<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Identity,_Gudhi::Toplex_map::Sptr_equal,_Gudhi::Toplex_map::Sptr_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::set<Toplex_map::Vertex> Toplex_map::unitary_collapse(const Toplex_map::Vertex k, const Toplex_map::Vertex d) {
  Toplex_map::Simplex r;
  for (const Toplex_map::Simplex_ptr& sptr : Simplex_ptr_set(t0.at(d))) {
    // Copy constructor needed because the set is modified
    Simplex sigma(*sptr);
    erase_maximal(sptr);
    sigma.erase(d);
    for (const Vertex v : sigma) r.insert(v);
    sigma.insert(k);
    insert_simplex(sigma);
  }
  return r;
}